

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pp.cpp
# Opt level: O1

int __thiscall glslang::TPpContext::CPPundef(TPpContext *this,TPpToken *ppToken)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  _Base_ptr p_Var3;
  char *pcVar4;
  _Base_ptr p_Var5;
  TParseContextBase *pTVar6;
  _func_int **pp_Var7;
  
  iVar2 = scanToken(this,ppToken);
  pTVar6 = this->parseContext;
  if (iVar2 == 0xa2) {
    (*(pTVar6->super_TParseVersions)._vptr_TParseVersions[0x37])
              (pTVar6,ppToken,ppToken->name,"#undef");
    iVar2 = TStringAtomMap::getAtom(&this->atomStrings,ppToken->name);
    p_Var1 = &(this->macroDefs).
              super_map<int,_glslang::TPpContext::MacroSymbol,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TPpContext::MacroSymbol>_>_>
              ._M_t._M_impl.super__Rb_tree_header;
    p_Var5 = (this->macroDefs).
             super_map<int,_glslang::TPpContext::MacroSymbol,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TPpContext::MacroSymbol>_>_>
             ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var3 = &p_Var1->_M_header;
    for (; p_Var5 != (_Base_ptr)0x0; p_Var5 = (&p_Var5->_M_left)[(int)p_Var5[1]._M_color < iVar2]) {
      if (iVar2 <= (int)p_Var5[1]._M_color) {
        p_Var3 = p_Var5;
      }
    }
    p_Var5 = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var3 != p_Var1) && (p_Var5 = p_Var3, iVar2 < (int)p_Var3[1]._M_color))
    {
      p_Var5 = &p_Var1->_M_header;
    }
    if ((_Rb_tree_header *)p_Var5 != p_Var1) {
      *(byte *)&p_Var5[3]._M_left = *(byte *)&p_Var5[3]._M_left | 4;
    }
    iVar2 = scanToken(this,ppToken);
    if (iVar2 == 10) {
      return 10;
    }
    pTVar6 = this->parseContext;
    pp_Var7 = (pTVar6->super_TParseVersions)._vptr_TParseVersions;
    pcVar4 = "can only be followed by a single macro name";
  }
  else {
    pp_Var7 = (pTVar6->super_TParseVersions)._vptr_TParseVersions;
    pcVar4 = "must be followed by macro name";
  }
  (*pp_Var7[0x2f])(pTVar6,ppToken,pcVar4,"#undef","");
  return iVar2;
}

Assistant:

int TPpContext::CPPundef(TPpToken* ppToken)
{
    int token = scanToken(ppToken);
    if (token != PpAtomIdentifier) {
        parseContext.ppError(ppToken->loc, "must be followed by macro name", "#undef", "");

        return token;
    }

    parseContext.reservedPpErrorCheck(ppToken->loc, ppToken->name, "#undef");

    MacroSymbol* macro = lookupMacroDef(atomStrings.getAtom(ppToken->name));
    if (macro != nullptr)
        macro->undef = 1;
    token = scanToken(ppToken);
    if (token != '\n')
        parseContext.ppError(ppToken->loc, "can only be followed by a single macro name", "#undef", "");

    return token;
}